

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O3

int mbedtls_x509_string_to_names(mbedtls_asn1_named_data **head,char *name)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  mbedtls_asn1_named_data *pmVar4;
  x509_attr_descriptor_t *pxVar5;
  uchar *puVar6;
  char *pcVar7;
  uchar uVar8;
  uchar *puVar9;
  uchar *puVar10;
  char data [256];
  uchar local_138 [264];
  
  sVar3 = strlen(name);
  mbedtls_asn1_free_named_data_list(head);
  if (-1 < (long)sVar3) {
    puVar10 = (uchar *)(name + sVar3);
    bVar1 = true;
    pcVar7 = (char *)0x0;
    puVar6 = local_138;
    puVar9 = (uchar *)name;
    do {
      uVar8 = *puVar9;
      if (bVar1) {
        if (uVar8 == '=') {
          pcVar7 = "CN";
          pxVar5 = x509_attrs;
          do {
            if ((pxVar5->name_len == (long)puVar9 - (long)name) &&
               (iVar2 = strncmp(pcVar7,name,(long)puVar9 - (long)name), iVar2 == 0))
            goto LAB_0010bf13;
            pcVar7 = pxVar5[1].name;
            pxVar5 = pxVar5 + 1;
          } while (pcVar7 != (char *)0x0);
          pxVar5 = (x509_attr_descriptor_t *)0x146cb0;
LAB_0010bf13:
          pcVar7 = pxVar5->oid;
          if (pcVar7 == (char *)0x0) {
            return -0x2100;
          }
          name = (char *)(puVar9 + 1);
          puVar6 = local_138;
          goto LAB_0010bf29;
        }
LAB_0010bf95:
        puVar9 = puVar9 + 1;
        bVar1 = true;
      }
      else {
LAB_0010bf29:
        if (puVar9 == puVar10 || uVar8 != '\\') {
          if (uVar8 == ',' || puVar9 == puVar10) {
            sVar3 = strlen(pcVar7);
            pmVar4 = mbedtls_asn1_store_named_data
                               (head,pcVar7,sVar3,local_138,(long)puVar6 - (long)local_138);
            name = (char *)puVar9;
            if (pmVar4 == (mbedtls_asn1_named_data *)0x0) {
              return -0x2880;
            }
            do {
              puVar9 = (uchar *)name;
              name = (char *)(puVar9 + 1);
              if (puVar10 <= puVar9) break;
            } while (*name == ' ');
            goto LAB_0010bf95;
          }
        }
        else {
          puVar9 = puVar9 + 1;
          if (puVar9 == puVar10) {
            return -0x2380;
          }
          uVar8 = ',';
          if (*puVar9 != ',') {
            return -0x2380;
          }
        }
        puVar9 = puVar9 + 1;
        bVar1 = false;
        if ((uchar *)name != puVar9) {
          *puVar6 = uVar8;
          if ((long)puVar6 - (long)local_138 == 0xff) {
            return -0x2380;
          }
          puVar6 = puVar6 + 1;
        }
      }
    } while (puVar9 <= puVar10);
  }
  return 0;
}

Assistant:

int mbedtls_x509_string_to_names( mbedtls_asn1_named_data **head, const char *name )
{
    int ret = 0;
    const char *s = name, *c = s;
    const char *end = s + strlen( s );
    const char *oid = NULL;
    int in_tag = 1;
    char data[MBEDTLS_X509_MAX_DN_NAME_SIZE];
    char *d = data;

    /* Clear existing chain if present */
    mbedtls_asn1_free_named_data_list( head );

    while( c <= end )
    {
        if( in_tag && *c == '=' )
        {
            if( ( oid = x509_at_oid_from_name( s, c - s ) ) == NULL )
            {
                ret = MBEDTLS_ERR_X509_UNKNOWN_OID;
                goto exit;
            }

            s = c + 1;
            in_tag = 0;
            d = data;
        }

        if( !in_tag && *c == '\\' && c != end )
        {
            c++;

            /* Check for valid escaped characters */
            if( c == end || *c != ',' )
            {
                ret = MBEDTLS_ERR_X509_INVALID_NAME;
                goto exit;
            }
        }
        else if( !in_tag && ( *c == ',' || c == end ) )
        {
            if( mbedtls_asn1_store_named_data( head, oid, strlen( oid ),
                                       (unsigned char *) data,
                                       d - data ) == NULL )
            {
                return( MBEDTLS_ERR_X509_ALLOC_FAILED );
            }

            while( c < end && *(c + 1) == ' ' )
                c++;

            s = c + 1;
            in_tag = 1;
        }

        if( !in_tag && s != c + 1 )
        {
            *(d++) = *c;

            if( d - data == MBEDTLS_X509_MAX_DN_NAME_SIZE )
            {
                ret = MBEDTLS_ERR_X509_INVALID_NAME;
                goto exit;
            }
        }

        c++;
    }

exit:

    return( ret );
}